

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void clearSelect(sqlite3 *db,Select *p,int bFree)

{
  Select *pSVar1;
  Select *pPrior;
  Select *pSStack_18;
  int bFree_local;
  Select *p_local;
  sqlite3 *db_local;
  
  pPrior._4_4_ = bFree;
  pSStack_18 = p;
  while (pSStack_18 != (Select *)0x0) {
    pSVar1 = pSStack_18->pPrior;
    sqlite3ExprListDelete(db,pSStack_18->pEList);
    sqlite3SrcListDelete(db,pSStack_18->pSrc);
    sqlite3ExprDelete(db,pSStack_18->pWhere);
    sqlite3ExprListDelete(db,pSStack_18->pGroupBy);
    sqlite3ExprDelete(db,pSStack_18->pHaving);
    sqlite3ExprListDelete(db,pSStack_18->pOrderBy);
    sqlite3ExprDelete(db,pSStack_18->pLimit);
    sqlite3ExprDelete(db,pSStack_18->pOffset);
    if (pSStack_18->pWith != (With *)0x0) {
      sqlite3WithDelete(db,pSStack_18->pWith);
    }
    if (pPrior._4_4_ != 0) {
      sqlite3DbFreeNN(db,pSStack_18);
    }
    pPrior._4_4_ = 1;
    pSStack_18 = pSVar1;
  }
  return;
}

Assistant:

static void clearSelect(sqlite3 *db, Select *p, int bFree){
  while( p ){
    Select *pPrior = p->pPrior;
    sqlite3ExprListDelete(db, p->pEList);
    sqlite3SrcListDelete(db, p->pSrc);
    sqlite3ExprDelete(db, p->pWhere);
    sqlite3ExprListDelete(db, p->pGroupBy);
    sqlite3ExprDelete(db, p->pHaving);
    sqlite3ExprListDelete(db, p->pOrderBy);
    sqlite3ExprDelete(db, p->pLimit);
    sqlite3ExprDelete(db, p->pOffset);
    if( p->pWith ) sqlite3WithDelete(db, p->pWith);
    if( bFree ) sqlite3DbFreeNN(db, p);
    p = pPrior;
    bFree = 1;
  }
}